

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

void Bac_NtkCreateAndConnectBuffer(Gia_Man_t *pGia,Gia_Obj_t *pObj,Bac_Ntk_t *p,int iTerm)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Bac_ObjType_t BVar3;
  bool bVar4;
  int iObj;
  int iTerm_local;
  Bac_Ntk_t *p_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *pGia_local;
  
  if (pGia != (Gia_Man_t *)0x0) {
    iVar1 = Gia_ObjFaninId0p(pGia,pObj);
    if (0 < iVar1) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Bac_ObjAlloc(p,BAC_OBJ_BI,pGVar2->Value);
      iVar1 = Gia_ObjFaninC0(pObj);
      BVar3 = BAC_BOX_BUF;
      if (iVar1 != 0) {
        BVar3 = BAC_BOX_INV;
      }
      Bac_ObjAlloc(p,BVar3,-1);
      goto LAB_00b4fcdf;
    }
  }
  bVar4 = false;
  if (pGia != (Gia_Man_t *)0x0) {
    iVar1 = Gia_ObjFaninC0(pObj);
    bVar4 = iVar1 != 0;
  }
  BVar3 = BAC_BOX_CF;
  if (bVar4) {
    BVar3 = BAC_BOX_CT;
  }
  Bac_ObjAlloc(p,BVar3,-1);
LAB_00b4fcdf:
  iVar1 = Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
  Bac_ObjSetFanin(p,iTerm,iVar1);
  return;
}

Assistant:

void Bac_NtkCreateAndConnectBuffer( Gia_Man_t * pGia, Gia_Obj_t * pObj, Bac_Ntk_t * p, int iTerm )
{
    int iObj;
    if ( pGia && Gia_ObjFaninId0p(pGia, pObj) > 0 )
    {
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BI, Gia_ObjFanin0(pObj)->Value );
        Bac_ObjAlloc( p, Gia_ObjFaninC0(pObj) ? BAC_BOX_INV : BAC_BOX_BUF, -1 );
    }
    else
    {
        Bac_ObjAlloc( p, pGia && Gia_ObjFaninC0(pObj) ? BAC_BOX_CT : BAC_BOX_CF, -1 );
    }
    iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    Bac_ObjSetFanin( p, iTerm, iObj );
}